

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonParseFillInParentage(JsonParse *pParse,u32 i,u32 iParent)

{
  u32 uVar1;
  JsonNode *pJVar2;
  uint local_24;
  u32 j;
  JsonNode *pNode;
  u32 iParent_local;
  u32 i_local;
  JsonParse *pParse_local;
  
  pJVar2 = pParse->aNode + i;
  pParse->aUp[i] = iParent;
  if (pJVar2->eType == '\a') {
    for (local_24 = 1; local_24 <= pJVar2->n; local_24 = uVar1 + local_24) {
      jsonParseFillInParentage(pParse,i + local_24,i);
      uVar1 = jsonNodeSize(pJVar2 + local_24);
    }
  }
  else if (pJVar2->eType == '\b') {
    for (local_24 = 1; local_24 <= pJVar2->n; local_24 = uVar1 + 1 + local_24) {
      pParse->aUp[i + local_24] = i;
      jsonParseFillInParentage(pParse,i + local_24 + 1,i);
      uVar1 = jsonNodeSize(pJVar2 + (ulong)local_24 + 1);
    }
  }
  return;
}

Assistant:

static void jsonParseFillInParentage(JsonParse *pParse, u32 i, u32 iParent){
  JsonNode *pNode = &pParse->aNode[i];
  u32 j;
  pParse->aUp[i] = iParent;
  switch( pNode->eType ){
    case JSON_ARRAY: {
      for(j=1; j<=pNode->n; j += jsonNodeSize(pNode+j)){
        jsonParseFillInParentage(pParse, i+j, i);
      }
      break;
    }
    case JSON_OBJECT: {
      for(j=1; j<=pNode->n; j += jsonNodeSize(pNode+j+1)+1){
        pParse->aUp[i+j] = i;
        jsonParseFillInParentage(pParse, i+j+1, i);
      }
      break;
    }
    default: {
      break;
    }
  }
}